

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_object.cpp
# Opt level: O0

bool __thiscall
mjs::string_object::do_redefine_own_property
          (string_object *this,string *name,value *val,property_attribute attr)

{
  bool bVar1;
  wstring_view property_name;
  undefined1 local_40 [8];
  wstring_view s;
  property_attribute attr_local;
  value *val_local;
  string *name_local;
  string_object *this_local;
  
  s._M_str._4_4_ = attr;
  property_name = string::view(name);
  _local_40 = handle_array_like_access(this,property_name);
  bVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::empty
                    ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)local_40);
  if (bVar1) {
    this_local._7_1_ =
         native_object::do_redefine_own_property(&this->super_native_object,name,val,s._M_str._4_4_)
    ;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool do_redefine_own_property(const string& name, const value& val, property_attribute attr) override {
        if (const auto s = handle_array_like_access(name.view()); !s.empty()) {
            return false;
        }
        return native_object::do_redefine_own_property(name, val, attr);
    }